

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void lang_help(TidyDoc tdoc)

{
  ctmbstr ptVar1;
  ctmbstr ptVar2;
  TidyDoc tdoc_local;
  
  printf(anon_var_dwarf_1353a + 0x15d);
  ptVar1 = tidyLocalizedString(0x361);
  printf(anon_var_dwarf_146e0 + 0x16,ptVar1);
  printf(anon_var_dwarf_1353a + 0x15d);
  tidyPrintWindowsLanguageNames("  %-20s -> %s\n");
  printf(anon_var_dwarf_1353a + 0x15d);
  ptVar1 = tidyLocalizedString(0x362);
  printf(anon_var_dwarf_146e0 + 0x16,ptVar1);
  printf(anon_var_dwarf_1353a + 0x15d);
  tidyPrintTidyLanguageNames("  %s\n");
  printf(anon_var_dwarf_1353a + 0x15d);
  ptVar1 = tidyLocalizedString(0x363);
  ptVar2 = tidyGetLanguage();
  printf(ptVar1,ptVar2);
  printf(anon_var_dwarf_1353a + 0x15d);
  return;
}

Assistant:

static void lang_help( TidyDoc tdoc )
{
    printf( "\n" );
    printf( "%s", tidyLocalizedString(TC_TXT_HELP_LANG_1) );
    printf( "\n" );
    tidyPrintWindowsLanguageNames("  %-20s -> %s\n");
    printf( "\n" );
    printf( "%s", tidyLocalizedString(TC_TXT_HELP_LANG_2) );
    printf( "\n" );
    tidyPrintTidyLanguageNames("  %s\n");
    printf( "\n" );
    printf( tidyLocalizedString(TC_TXT_HELP_LANG_3), tidyGetLanguage() );
    printf( "\n" );
}